

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

int netaddr_create_host_bin(netaddr *host,netaddr *netmask,void *number,size_t num_length)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  
  uVar6 = *(undefined8 *)(netmask->_addr + 8);
  *(undefined8 *)host->_addr = *(undefined8 *)netmask->_addr;
  *(undefined8 *)(host->_addr + 8) = uVar6;
  uVar4 = netmask->_type;
  uVar5 = netmask->_prefix_len;
  host->_type = uVar4;
  host->_prefix_len = uVar5;
  if ((byte)uVar4 < 0x2f) {
    if (uVar4 == 2) {
      bVar10 = 0x20;
    }
    else {
      if (uVar4 != 10) {
LAB_00104c6a:
        host->_prefix_len = '\0';
        return -1;
      }
      bVar10 = 0x80;
    }
  }
  else if (uVar4 == 0x2f) {
    bVar10 = 0x30;
  }
  else {
    if (uVar4 != 0x30) goto LAB_00104c6a;
    bVar10 = 0x40;
  }
  host->_prefix_len = bVar10;
  bVar3 = netmask->_prefix_len;
  if (num_length != 0 && bVar10 != bVar3) {
    uVar1 = ((uint)bVar10 - (uint)bVar3) + 7;
    uVar8 = ((uint)bVar10 - (uint)bVar3) + 0xe;
    if (-1 < (short)uVar1) {
      uVar8 = uVar1;
    }
    uVar7 = (ulong)(uVar8 >> 3 & 0xff);
    lVar9 = num_length - uVar7;
    if (num_length < uVar7) {
      uVar7 = (bVar10 >> 3) - num_length;
      lVar9 = 0;
    }
    else {
      uVar7 = (ulong)(bVar3 >> 3);
      if ((bVar3 & 7) != 0) {
        bVar10 = (byte)(-0x100 >> (bVar3 & 7)) & host->_addr[uVar7];
        host->_addr[uVar7] = bVar10;
        pbVar2 = (byte *)((long)number + lVar9);
        lVar9 = lVar9 + 1;
        host->_addr[uVar7] = (byte)(0xff >> (bVar3 & 7)) & *pbVar2 | bVar10;
        uVar7 = uVar7 + 1;
      }
    }
    memcpy(host->_addr + uVar7,(void *)((long)number + lVar9),num_length - lVar9);
  }
  return 0;
}

Assistant:

int
netaddr_create_host_bin(struct netaddr *host, const struct netaddr *netmask, const void *number, size_t num_length) {
  size_t host_index, number_index;
  uint8_t host_part_length;
  const uint8_t *number_byte;
  uint8_t mask;

  number_byte = number;

  /* copy netmask with prefixlength max */
  memcpy(host, netmask, sizeof(*netmask));
  host->_prefix_len = netaddr_get_maxprefix(host);

  /* unknown address type */
  if (host->_prefix_len == 0) {
    return -1;
  }

  /* netmask has no host part */
  if (host->_prefix_len == netmask->_prefix_len || num_length == 0) {
    return 0;
  }

  /* calculate starting byte in host and number */
  host_part_length = (host->_prefix_len - netmask->_prefix_len + 7) / 8;
  if (host_part_length > num_length) {
    host_index = host->_prefix_len / 8 - num_length;
    number_index = 0;
  }
  else {
    host_index = netmask->_prefix_len / 8;
    number_index = num_length - host_part_length;

    /* copy bit masked part */
    if ((netmask->_prefix_len & 7) != 0) {
      mask = (255 >> (netmask->_prefix_len & 7));
      host->_addr[host_index] &= (~mask);
      host->_addr[host_index] |= (number_byte[number_index++]) & mask;
      host_index++;
    }
  }

  /* copy bytes */
  memcpy(&host->_addr[host_index], &number_byte[number_index], num_length - number_index);
  return 0;
}